

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

void duckdb_zstd::ZSTD_initCCtx(ZSTD_CCtx *cctx,ZSTD_customMem memManager)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  
  switchD_00569a20::default(cctx,0,0x1480);
  (cctx->customMem).customAlloc = memManager.customAlloc;
  (cctx->customMem).customFree = memManager.customFree;
  (cctx->customMem).opaque = memManager.opaque;
  puVar1 = (uint *)cpuid_basic_info(0);
  uVar3 = 0;
  if ((*puVar1 != 0) && (uVar3 = 0, 6 < *puVar1)) {
    uVar3 = 0;
    lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
    if ((*(uint *)(lVar2 + 4) & 8) != 0) {
      uVar3 = *(uint *)(lVar2 + 4) >> 8 & 1;
    }
  }
  cctx->bmi2 = uVar3;
  ZSTD_clearAllDicts(cctx);
  switchD_00569a20::default(&cctx->requestedParams,0,0xd8);
  (cctx->requestedParams).compressionLevel = 3;
  (cctx->requestedParams).fParams.contentSizeFlag = 1;
  return;
}

Assistant:

static void ZSTD_initCCtx(ZSTD_CCtx* cctx, ZSTD_customMem memManager)
{
    assert(cctx != NULL);
    ZSTD_memset(cctx, 0, sizeof(*cctx));
    cctx->customMem = memManager;
    cctx->bmi2 = ZSTD_cpuSupportsBmi2();
    {   size_t const err = ZSTD_CCtx_reset(cctx, ZSTD_reset_parameters);
        assert(!ZSTD_isError(err));
        (void)err;
    }
}